

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinInputVariationsCaseInstance *this)

{
  float y_00;
  bool bVar1;
  uint width_00;
  uint height_00;
  int iVar2;
  TextureLevel *this_00;
  TestContext *this_01;
  TestLog *log;
  float fVar3;
  allocator<char> local_181;
  string local_180;
  undefined4 local_160;
  allocator<char> local_159;
  string local_158;
  RGBA local_138;
  Vector<float,_4> local_134;
  Vector<float,_4> local_124;
  float local_114;
  undefined1 local_110 [4];
  float xf;
  Vec4 color;
  int x;
  int y;
  PixelBufferAccess local_d0;
  Vec4 local_a8;
  deUint16 adStack_98 [4];
  deUint16 indices [12];
  VkPushConstantRange pcRanges;
  bool compareOk;
  undefined1 local_60 [8];
  Surface refImage;
  Surface resImage;
  RGBA threshold;
  int height;
  int width;
  UVec2 viewportSize;
  BuiltinInputVariationsCaseInstance *this_local;
  
  viewportSize.m_data = (uint  [2])this;
  ShaderRenderCaseInstance::getViewportSize((ShaderRenderCaseInstance *)&height);
  width_00 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&height);
  height_00 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&height);
  tcu::RGBA::RGBA((RGBA *)((long)&resImage.m_pixels.m_cap + 4),2,2,2,2);
  tcu::Surface::Surface((Surface *)&refImage.m_pixels.m_cap,width_00,height_00);
  tcu::Surface::Surface((Surface *)local_60,width_00,height_00);
  indices[8] = 0x10;
  indices[9] = 0;
  indices[10] = 0;
  indices[0xb] = 0;
  indices[4] = 3;
  indices[5] = 1;
  indices[6] = 3;
  indices[7] = 4;
  adStack_98[0] = 0;
  adStack_98[1] = 4;
  adStack_98[2] = 1;
  adStack_98[3] = 0;
  indices[0] = 5;
  indices[1] = 4;
  indices[2] = 1;
  indices[3] = 2;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])();
  if ((this->m_shaderInputTypes & 4) != 0) {
    ShaderRenderCaseInstance::setPushConstantRanges
              (&this->super_ShaderRenderCaseInstance,1,(VkPushConstantRange *)(indices + 8));
  }
  ShaderRenderCaseInstance::getDefaultConstCoords();
  ShaderRenderCaseInstance::render(&this->super_ShaderRenderCaseInstance,6,4,adStack_98,&local_a8);
  tcu::Surface::getAccess(&local_d0,(Surface *)&refImage.m_pixels.m_cap);
  this_00 = ShaderRenderCaseInstance::getResultImage(&this->super_ShaderRenderCaseInstance);
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&x,this_00);
  tcu::copy((EVP_PKEY_CTX *)&local_d0,(EVP_PKEY_CTX *)&x);
  for (color.m_data[3] = 0.0; fVar3 = color.m_data[3],
      iVar2 = tcu::Surface::getHeight((Surface *)local_60), (int)fVar3 < iVar2;
      color.m_data[3] = (float)((int)color.m_data[3] + 1)) {
    for (color.m_data[2] = 0.0; fVar3 = color.m_data[2],
        iVar2 = tcu::Surface::getWidth((Surface *)local_60), (int)fVar3 < iVar2;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_110,0.1,0.2,0.3,1.0);
      fVar3 = color.m_data[2];
      if ((((this->m_shaderInputTypes & 1) != 0) &&
          (iVar2 = tcu::Surface::getWidth((Surface *)local_60), (int)fVar3 < iVar2 / 2)) ||
         ((this->m_shaderInputTypes & 1) == 0)) {
        if ((this->m_shaderInputTypes & 2) == 0) {
          tcu::Vector<float,_4>::Vector(&local_134,0.3,0.2,0.1,0.0);
          tcu::Vector<float,_4>::operator+=((Vector<float,_4> *)local_110,&local_134);
        }
        else {
          fVar3 = (float)(int)color.m_data[2];
          iVar2 = tcu::Surface::getWidth((Surface *)local_60);
          local_114 = (fVar3 + 0.5) / (float)iVar2;
          tcu::Vector<float,_4>::Vector(&local_124,(1.0 - local_114) * 0.6,local_114 * 0.6,0.0,0.0);
          tcu::Vector<float,_4>::operator+=((Vector<float,_4> *)local_110,&local_124);
        }
      }
      if ((this->m_shaderInputTypes & 4) != 0) {
        tcu::Vector<float,_4>::operator+=((Vector<float,_4> *)local_110,&this->m_constantColor);
      }
      y_00 = color.m_data[3];
      fVar3 = color.m_data[2];
      tcu::RGBA::RGBA(&local_138,(Vec4 *)local_110);
      tcu::Surface::setPixel((Surface *)local_60,(int)fVar3,(int)y_00,local_138);
    }
  }
  this_01 = Context::getTestContext
                      ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_01);
  bVar1 = tcu::pixelThresholdCompare
                    (log,"Result","Image comparison result",(Surface *)local_60,
                     (Surface *)&refImage.m_pixels.m_cap,
                     (RGBA *)((long)&resImage.m_pixels.m_cap + 4),COMPARE_LOG_RESULT);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Result image matches reference",&local_159);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"Image mismatch",&local_181);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
  }
  local_160 = 1;
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&refImage.m_pixels.m_cap);
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinInputVariationsCaseInstance::iterate (void)
{
	const UVec2					viewportSize	= getViewportSize();
	const int					width			= viewportSize.x();
	const int					height			= viewportSize.y();
	const tcu::RGBA				threshold		(2, 2, 2, 2);
	Surface						resImage		(width, height);
	Surface						refImage		(width, height);
	bool						compareOk		= false;
	const VkPushConstantRange	pcRanges		=
	{
		VK_SHADER_STAGE_FRAGMENT_BIT,	// VkShaderStageFlags	stageFlags;
		0u,								// deUint32				offset;
		sizeof(Vec4)					// deUint32				size;
	};
	const deUint16				indices[12]		=
	{
		0, 4, 1,
		0, 5, 4,
		1, 2, 3,
		1, 3, 4
	};

	setup();

	if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
		setPushConstantRanges(1, &pcRanges);

	render(6, 4, indices);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Reference image
	for (int y = 0; y < refImage.getHeight(); y++)
	{
		for (int x = 0; x < refImage.getWidth(); x++)
		{
			Vec4 color (0.1f, 0.2f, 0.3f, 1.0f);

			if (((m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT) && (x < refImage.getWidth() / 2)) ||
				!(m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT))
			{
				if (m_shaderInputTypes & SHADER_INPUT_VARYING_BIT)
				{
					const float xf = (float(x)+.5f) / float(refImage.getWidth());
					color += Vec4(0.6f * (1 - xf), 0.6f * xf, 0.0f, 0.0f);
				}
				else
					color += Vec4(0.3f, 0.2f, 0.1f, 0.0f);
			}

			if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
				color += m_constantColor;

			refImage.setPixel(x, y, RGBA(color));
		}
	}

	compareOk = pixelThresholdCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}